

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusintegrator.cpp
# Opt level: O0

bool __thiscall
QDBusConnectionPrivate::shouldWatchService(QDBusConnectionPrivate *this,QString *service)

{
  long lVar1;
  bool bVar2;
  long in_RDI;
  long in_FS_OFFSET;
  QString *in_stack_ffffffffffffffa8;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  undefined1 local_21;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(int *)(in_RDI + 0x60) == 2) {
    bVar2 = QString::isEmpty((QString *)0x16dfac);
    if (bVar2) {
      local_21 = false;
    }
    else {
      QDBusUtil::dbusService();
      bVar2 = ::operator==((QString *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
                           in_stack_ffffffffffffffa8);
      QString::~QString((QString *)0x16dfea);
      if (bVar2) {
        local_21 = false;
      }
      else {
        local_21 = true;
      }
    }
  }
  else {
    local_21 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_21;
  }
  __stack_chk_fail();
}

Assistant:

bool QDBusConnectionPrivate::shouldWatchService(const QString &service)
{
    // we don't have to watch anything in peer mode
    if (mode != ClientMode)
        return false;
    // we don't have to watch wildcard services (empty strings)
    if (service.isEmpty())
        return false;
    // we don't have to watch the bus driver
    if (service == QDBusUtil::dbusService())
        return false;
    return true;
}